

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

float Nwk_NodeComputeArrival(Nwk_Obj_t *pObj,int fUseSorting)

{
  If_LibLut_t *pIVar1;
  int iVar2;
  Nwk_Obj_t *pNVar3;
  bool bVar4;
  float fVar5;
  int local_144;
  int k;
  float *pDelays;
  Nwk_Obj_t *pNStack_130;
  float tArrival;
  Nwk_Obj_t *pFanin;
  float pPinDelays [32];
  int pPinPerm [32];
  If_LibLut_t *pLutLib;
  int fUseSorting_local;
  Nwk_Obj_t *pObj_local;
  
  pIVar1 = pObj->pMan->pLutLib;
  iVar2 = Nwk_ObjIsNode(pObj);
  if (((iVar2 == 0) && (iVar2 = Nwk_ObjIsCi(pObj), iVar2 == 0)) &&
     (iVar2 = Nwk_ObjIsCo(pObj), iVar2 == 0)) {
    __assert_fail("Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) || Nwk_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x8b,"float Nwk_NodeComputeArrival(Nwk_Obj_t *, int)");
  }
  iVar2 = Nwk_ObjIsCi(pObj);
  if (iVar2 == 0) {
    iVar2 = Nwk_ObjIsCo(pObj);
    if (iVar2 == 0) {
      pDelays._4_4_ = -1e+09;
      if (pIVar1 == (If_LibLut_t *)0x0) {
        local_144 = 0;
        while( true ) {
          bVar4 = false;
          if (local_144 < pObj->nFanins) {
            pNStack_130 = pObj->pFanio[local_144];
            bVar4 = pNStack_130 != (Nwk_Obj_t *)0x0;
          }
          if (!bVar4) break;
          fVar5 = Nwk_ObjArrival(pNStack_130);
          if (pDelays._4_4_ < fVar5 + 1.0) {
            fVar5 = Nwk_ObjArrival(pNStack_130);
            pDelays._4_4_ = fVar5 + 1.0;
          }
          local_144 = local_144 + 1;
        }
      }
      else if (pIVar1->fVarPinDelays == 0) {
        iVar2 = Nwk_ObjFaninNum(pObj);
        local_144 = 0;
        while( true ) {
          bVar4 = false;
          if (local_144 < pObj->nFanins) {
            pNStack_130 = pObj->pFanio[local_144];
            bVar4 = pNStack_130 != (Nwk_Obj_t *)0x0;
          }
          if (!bVar4) break;
          fVar5 = Nwk_ObjArrival(pNStack_130);
          if (pDelays._4_4_ < fVar5 + pIVar1->pLutDelays[iVar2][0]) {
            fVar5 = Nwk_ObjArrival(pNStack_130);
            pDelays._4_4_ = fVar5 + pIVar1->pLutDelays[iVar2][0];
          }
          local_144 = local_144 + 1;
        }
      }
      else {
        iVar2 = Nwk_ObjFaninNum(pObj);
        if (fUseSorting == 0) {
          local_144 = 0;
          while( true ) {
            bVar4 = false;
            if (local_144 < pObj->nFanins) {
              pNStack_130 = pObj->pFanio[local_144];
              bVar4 = pNStack_130 != (Nwk_Obj_t *)0x0;
            }
            if (!bVar4) break;
            fVar5 = Nwk_ObjArrival(pNStack_130);
            if (pDelays._4_4_ < fVar5 + pIVar1->pLutDelays[iVar2][local_144]) {
              fVar5 = Nwk_ObjArrival(pNStack_130);
              pDelays._4_4_ = fVar5 + pIVar1->pLutDelays[iVar2][local_144];
            }
            local_144 = local_144 + 1;
          }
        }
        else {
          Nwk_ManDelayTraceSortPins(pObj,(int *)(pPinDelays + 0x1e),(float *)&pFanin);
          local_144 = 0;
          while( true ) {
            bVar4 = false;
            if (local_144 < pObj->nFanins) {
              bVar4 = pObj->pFanio[local_144] != (Nwk_Obj_t *)0x0;
            }
            if (!bVar4) break;
            pNVar3 = Nwk_ObjFanin(pObj,(int)pPinDelays[(long)local_144 + 0x1e]);
            fVar5 = Nwk_ObjArrival(pNVar3);
            if (pDelays._4_4_ < fVar5 + pIVar1->pLutDelays[iVar2][local_144]) {
              pNVar3 = Nwk_ObjFanin(pObj,(int)pPinDelays[(long)local_144 + 0x1e]);
              fVar5 = Nwk_ObjArrival(pNVar3);
              pDelays._4_4_ = fVar5 + pIVar1->pLutDelays[iVar2][local_144];
            }
            local_144 = local_144 + 1;
          }
        }
      }
      iVar2 = Nwk_ObjFaninNum(pObj);
      if (iVar2 == 0) {
        pDelays._4_4_ = 0.0;
      }
      pObj_local._4_4_ = pDelays._4_4_;
    }
    else {
      pNVar3 = Nwk_ObjFanin0(pObj);
      pObj_local._4_4_ = Nwk_ObjArrival(pNVar3);
    }
  }
  else {
    pObj_local._4_4_ = Nwk_ObjArrival(pObj);
  }
  return pObj_local._4_4_;
}

Assistant:

float Nwk_NodeComputeArrival( Nwk_Obj_t * pObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = pObj->pMan->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    Nwk_Obj_t * pFanin;
    float tArrival, * pDelays;
    int k;
    assert( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) || Nwk_ObjIsCo(pObj) );
    if ( Nwk_ObjIsCi(pObj) )
        return Nwk_ObjArrival(pObj);
    if ( Nwk_ObjIsCo(pObj) )
        return Nwk_ObjArrival( Nwk_ObjFanin0(pObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( tArrival < Nwk_ObjArrival(pFanin) + 1.0 )
                tArrival = Nwk_ObjArrival(pFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( tArrival < Nwk_ObjArrival(pFanin) + pDelays[0] )
                tArrival = Nwk_ObjArrival(pFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        if ( fUseSorting )
        {
            Nwk_ManDelayTraceSortPins( pObj, pPinPerm, pPinDelays );
            Nwk_ObjForEachFanin( pObj, pFanin, k ) 
                if ( tArrival < Nwk_ObjArrival(Nwk_ObjFanin(pObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Nwk_ObjArrival(Nwk_ObjFanin(pObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
                if ( tArrival < Nwk_ObjArrival(pFanin) + pDelays[k] )
                    tArrival = Nwk_ObjArrival(pFanin) + pDelays[k];
        }
    }
    if ( Nwk_ObjFaninNum(pObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}